

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

ly_bool json_print_array_is_last_inst(jsonpr_ctx *pctx,lyd_node *node)

{
  int iVar1;
  lyd_node *node_local;
  jsonpr_ctx *pctx_local;
  
  iVar1 = is_open_array(pctx,node);
  if (iVar1 == 0) {
    pctx_local._7_1_ = '\0';
  }
  else if ((pctx->root == node) && ((pctx->options & 1) == 0)) {
    pctx_local._7_1_ = '\x01';
  }
  else if ((node->next == (lyd_node *)0x0) || (node->next->schema != node->schema)) {
    pctx_local._7_1_ = '\x01';
  }
  else {
    pctx_local._7_1_ = '\0';
  }
  return pctx_local._7_1_;
}

Assistant:

static ly_bool
json_print_array_is_last_inst(struct jsonpr_ctx *pctx, const struct lyd_node *node)
{
    if (!is_open_array(pctx, node)) {
        /* no array open */
        return 0;
    }

    if ((pctx->root == node) && !(pctx->options & LYD_PRINT_WITHSIBLINGS)) {
        /* the only printed instance */
        return 1;
    }

    if (!node->next || (node->next->schema != node->schema)) {
        /* last instance */
        return 1;
    }

    return 0;
}